

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O1

void flatview_add_to_dispatch_arm(uc_struct_conflict1 *uc,FlatView *fv,MemoryRegionSection *section)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t nb;
  hwaddr hVar4;
  uint16_t leaf;
  ulong uVar5;
  byte bVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  ulong uVar9;
  uint64_t r_2;
  ulong uVar10;
  uint64_t r;
  ulong uVar11;
  bool bVar12;
  MemoryRegionSection remain;
  MemoryRegionSection now;
  MemoryRegionSection local_c8;
  FlatView *local_88;
  AddressSpaceDispatch *local_80;
  MemoryRegionSection local_78;
  
  local_c8.size._0_8_ = (ulong)section->size;
  local_c8.size._8_8_ = *(ulong *)((long)&section->size + 8);
  local_c8.mr = section->mr;
  local_c8.fv = section->fv;
  local_c8.offset_within_region = section->offset_within_region;
  uVar2 = section->offset_within_address_space;
  local_c8.readonly = section->readonly;
  local_c8._49_7_ = *(undefined7 *)&section->field_0x31;
  local_c8._56_8_ = *(undefined8 *)&section->field_0x38;
  uVar5 = (ulong)uc->init_target_page->mask;
  uVar10 = -uVar5;
  local_c8.offset_within_address_space = uVar2;
  if ((uVar2 & ~uVar5) != 0) {
    uVar11 = (uVar5 & (uVar2 + uVar10) - 1) - uVar2;
    uVar3 = (ulong)section->size;
    uVar9 = *(ulong *)((long)&section->size + 8);
    local_78.mr = section->mr;
    local_78.fv = section->fv;
    local_78.offset_within_region = section->offset_within_region;
    local_78.offset_within_address_space = section->offset_within_address_space;
    local_78.readonly = section->readonly;
    local_78._49_7_ = *(undefined7 *)&section->field_0x31;
    local_78._56_8_ = *(undefined8 *)&section->field_0x38;
    if ((long)-uVar9 < (long)(ulong)(uVar11 < uVar3)) {
      uVar9 = 0;
      uVar3 = uVar11;
    }
    local_78.size._0_8_ = uVar3;
    local_78.size._8_8_ = uVar9;
    register_subpage(uc,fv,&local_78);
    if (local_c8.size._8_8_ == uVar9 && (ulong)local_c8.size == uVar3) {
      return;
    }
    bVar12 = (ulong)local_c8.size < uVar3;
    local_c8.size._0_8_ = (ulong)local_c8.size - uVar3;
    local_c8.size._8_8_ = (local_c8.size._8_8_ - uVar9) - (ulong)bVar12;
    if (uVar9 != 0) goto LAB_0054ecfa;
    local_c8.offset_within_address_space = uVar2 + uVar3;
    local_c8.offset_within_region = local_c8.offset_within_region + uVar3;
  }
  hVar4 = local_c8.offset_within_address_space;
  uVar3 = local_c8.size._8_8_;
  uVar2 = (ulong)local_c8.size;
  if ((long)local_c8.size._8_8_ < (long)(ulong)((ulong)local_c8.size < uVar10)) {
LAB_0054ecdd:
    register_subpage(uc,fv,&local_c8);
    return;
  }
  local_78.readonly = local_c8.readonly;
  local_78._49_7_ = local_c8._49_7_;
  local_78._56_8_ = local_c8._56_8_;
  local_78.offset_within_region = local_c8.offset_within_region;
  local_78.offset_within_address_space = local_c8.offset_within_address_space;
  uVar10 = -(ulong)(uVar10 != 0) & local_c8.size._8_8_;
  local_78.mr = local_c8.mr;
  local_78.fv = local_c8.fv;
  uVar5 = uVar5 & (ulong)local_c8.size;
  local_80 = fv->dispatch;
  local_88 = fv;
  local_78.size._0_8_ = uVar5;
  local_78.size._8_8_ = uVar10;
  leaf = phys_section_add(uc,&local_80->map,&local_78);
  uVar1 = uc->init_target_page->bits;
  bVar6 = (byte)uVar1;
  uVar7 = (long)uVar10 >> (bVar6 & 0x3f);
  uVar8 = uVar7;
  nb = uVar5 >> (bVar6 & 0x3f) | uVar10 << 0x40 - (bVar6 & 0x3f);
  if ((uVar1 & 0x40) != 0) {
    uVar8 = (long)uVar10 >> 0x3f;
    nb = uVar7;
  }
  if (uVar8 == 0) {
    if (nb == 0) {
      __assert_fail("num_pages",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                    ,0x38d,
                    "void register_multipage(struct uc_struct *, FlatView *, MemoryRegionSection *)"
                   );
    }
    phys_page_set(local_80,hVar4 >> (bVar6 & 0x3f),nb,leaf);
    if (uVar3 == uVar10 && uVar2 == uVar5) {
      return;
    }
    local_c8.size._0_8_ = uVar2 - uVar5;
    local_c8.size._8_8_ = (uVar3 - uVar10) - (ulong)(uVar2 < uVar5);
    if (uVar10 == 0) {
      local_c8.offset_within_address_space = local_c8.offset_within_address_space + uVar5;
      local_c8.offset_within_region = local_c8.offset_within_region + uVar5;
      fv = local_88;
      goto LAB_0054ecdd;
    }
  }
LAB_0054ecfa:
  __assert_fail("r == a",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/int128.h"
                ,0x16,"uint64_t int128_get64(Int128)");
}

Assistant:

void flatview_add_to_dispatch(struct uc_struct *uc, FlatView *fv, MemoryRegionSection *section)
{
    MemoryRegionSection remain = *section;
    Int128 page_size = int128_make64(TARGET_PAGE_SIZE);

    /* register first subpage */
    if (remain.offset_within_address_space & ~TARGET_PAGE_MASK) {
        uint64_t left = TARGET_PAGE_ALIGN(remain.offset_within_address_space)
                        - remain.offset_within_address_space;

        MemoryRegionSection now = remain;
        now.size = int128_min(int128_make64(left), now.size);
        register_subpage(uc, fv, &now);
        if (int128_eq(remain.size, now.size)) {
            return;
        }
        remain.size = int128_sub(remain.size, now.size);
        remain.offset_within_address_space += int128_get64(now.size);
        remain.offset_within_region += int128_get64(now.size);
    }

    /* register whole pages */
    if (int128_ge(remain.size, page_size)) {
        MemoryRegionSection now = remain;
        now.size = int128_and(now.size, int128_neg(page_size));
        register_multipage(uc, fv, &now);
        if (int128_eq(remain.size, now.size)) {
            return;
        }
        remain.size = int128_sub(remain.size, now.size);
        remain.offset_within_address_space += int128_get64(now.size);
        remain.offset_within_region += int128_get64(now.size);
    }

    /* register last subpage */
    register_subpage(uc, fv, &remain);
}